

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarExpandedReader.cpp
# Opt level: O2

bool ZXing::OneD::IsCharacterPair(PatternView *v)

{
  bool bVar1;
  float modSizeRef;
  PatternView local_48;
  PatternView local_28;
  
  modSizeRef = DataBar::ModSizeFinder(v);
  local_28._data = v->_data;
  local_28._size = 8;
  local_28._base = v->_base;
  local_28._end = v->_end;
  bVar1 = DataBar::IsCharacter(&local_28,0x11,modSizeRef);
  if (bVar1) {
    bVar1 = true;
    if (v->_size != 0xf) {
      local_48._data = v->_data + 0xd;
      local_48._size = 8;
      local_48._base = v->_base;
      local_48._end = v->_end;
      bVar1 = DataBar::IsCharacter(&local_48,0x11,modSizeRef);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool IsCharacterPair(const PatternView& v)
{
	float modSizeRef = ModSizeFinder(v);
	return IsCharacter(LeftChar(v), 17, modSizeRef) &&
		   (v.size() == HALF_PAIR_SIZE || IsCharacter(RightChar(v), 17, modSizeRef));
}